

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O0

char * UniqueObjectHelper<char*>(int index)

{
  bool bVar1;
  value_type *ppcVar2;
  const_reference ppcVar3;
  uint in_EDI;
  element_adaptor eVar4;
  char buffer [64];
  size_type table_size;
  value_type *val;
  sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_> *this;
  undefined1 in_stack_ffffffffffffff90 [16];
  size_type i;
  sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>
  *in_stack_ffffffffffffffa0;
  char local_58 [72];
  value_type *local_10;
  uint local_4;
  
  local_4 = in_EDI;
  for (local_10 = (value_type *)
                  google::
                  sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>
                  ::size(&g_unique_charstar_objects); (int)local_10 <= (int)local_4;
      local_10 = (value_type *)((long)local_10 << 1)) {
  }
  val = local_10;
  ppcVar2 = (value_type *)
            google::
            sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
            size(&g_unique_charstar_objects);
  if (ppcVar2 < val) {
    google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
    resize((sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_> *)
           buffer._48_8_,buffer._40_8_);
  }
  bVar1 = google::
          sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
          test(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90._8_8_);
  this = in_stack_ffffffffffffff90._0_8_;
  i = in_stack_ffffffffffffff90._8_8_;
  if (!bVar1) {
    snprintf(local_58,0x40,"%d",(ulong)local_4);
    in_stack_ffffffffffffffa0 =
         (sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_> *)
         strdup(local_58);
    eVar4 = google::
            sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
            operator[](this,(size_type)val);
    i = eVar4.pos;
    google::
    table_element_adaptor<google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>
    ::operator=((table_element_adaptor<google::sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>_>
                 *)eVar4.table,val);
  }
  ppcVar3 = google::
            sparsetable<char_*,_(unsigned_short)48,_google::libc_allocator_with_realloc<char_*>_>::
            get(in_stack_ffffffffffffffa0,i);
  return *ppcVar3;
}

Assistant:

char* UniqueObjectHelper(int index) {
  // First grow the table if need be.
  sparsetable<char*>::size_type table_size = g_unique_charstar_objects.size();
  while (index >= static_cast<int>(table_size)) {
    assert(table_size * 2 > table_size);  // avoid overflow problems
    table_size *= 2;
  }
  if (table_size > g_unique_charstar_objects.size())
    g_unique_charstar_objects.resize(table_size);

  if (!g_unique_charstar_objects.test(index)) {
    char buffer[64];
    snprintf(buffer, sizeof(buffer), "%d", index);
    g_unique_charstar_objects[index] = strdup(buffer);
  }
  return g_unique_charstar_objects.get(index);
}